

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall Inline::IsArgumentsOpnd(Inline *this,Opnd *opnd)

{
  bool bVar1;
  StackSym *pSVar2;
  Instr *pIVar3;
  Opnd *this_00;
  
  while (this_00 = opnd, this_00 != (Opnd *)0x0) {
    bVar1 = IR::Opnd::IsArgumentsObject(this_00);
    if (bVar1) break;
    pSVar2 = IR::Opnd::GetStackSym(this_00);
    opnd = (Opnd *)0x0;
    if (pSVar2 != (StackSym *)0x0) {
      pSVar2 = IR::Opnd::GetStackSym(this_00);
      opnd = (Opnd *)0x0;
      if (((pSVar2->field_0x18 & 1) != 0) &&
         (opnd = (Opnd *)0x0, (pSVar2->field_5).m_instrDef != (Instr *)0x0)) {
        pSVar2 = IR::Opnd::GetStackSym(this_00);
        if ((pSVar2->field_0x18 & 1) == 0) {
          pIVar3 = (Instr *)0x0;
        }
        else {
          pIVar3 = (pSVar2->field_5).m_instrDef;
        }
        opnd = pIVar3->m_src1;
      }
    }
  }
  return this_00 != (Opnd *)0x0;
}

Assistant:

bool
Inline::IsArgumentsOpnd(IR::Opnd* opnd)
{
    IR::Opnd * checkOpnd = opnd;
    while (checkOpnd)
    {
        if (checkOpnd->IsArgumentsObject())
        {
            return true;
        }
        checkOpnd = checkOpnd->GetStackSym() && checkOpnd->GetStackSym()->IsSingleDef() ? checkOpnd->GetStackSym()->GetInstrDef()->GetSrc1() : nullptr;
    }

    return false;
}